

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O3

Status __thiscall google::protobuf::json_internal::JsonLexer::SkipValue(JsonLexer *this)

{
  int *piVar1;
  int iVar2;
  char cVar3;
  bool bVar4;
  bool bVar5;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>_1 aVar6
  ;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
  aVar7;
  char *pcVar8;
  Status *_status;
  JsonLexer *in_RSI;
  string_view literal;
  string_view literal_00;
  string_view literal_01;
  string_view literal_02;
  string_view literal_03;
  string_view literal_04;
  StatusOr<google::protobuf::json_internal::JsonLexer::Kind> kind;
  StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  key;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>_1
  local_f0;
  undefined4 local_e8;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
  local_e0 [11];
  StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  local_88;
  
  PeekKind((JsonLexer *)&local_f0.status_);
  (this->stream_).stream_ = (ZeroCopyInputStream *)local_f0;
  aVar6 = local_f0;
  if (((ulong)local_f0 & 1) == 0) {
    LOCK();
    *(int *)local_f0 = *(int *)local_f0 + 1;
    UNLOCK();
    aVar6.status_.rep_ = (Status)(this->stream_).stream_;
  }
  if (aVar6 != (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>_1
                )0x1) goto LAB_002b71a8;
  if (local_f0 !=
      (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>_1)
      0x1) {
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_f0.status_);
LAB_002b7449:
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_e0[0].status_);
switchD_002b7098_default:
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_e0,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/json/internal/lexer.cc"
               ,0xa5,5,"false");
    absl::lts_20240722::log_internal::LogMessage::operator<<
              ((LogMessage *)&local_e0[0].status_,(char (*) [12])"unreachable");
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_e0[0].status_);
  }
  switch(local_e8) {
  case 0:
    Expect(this);
    if ((this->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_002b71a8;
    iVar2 = (in_RSI->options_).recursion_depth;
    if (iVar2 == 0) {
      JsonLocation::Invalid
                ((JsonLocation *)this,&in_RSI->json_loc_,0x22,"JSON content was too deeply nested");
      if ((this->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_002b71a8;
    }
    else {
      (in_RSI->options_).recursion_depth = iVar2 + -1;
      (this->stream_).stream_ = (ZeroCopyInputStream *)0x1;
    }
    literal._M_str = "}";
    literal._M_len = 1;
    bVar4 = Peek(in_RSI,literal);
    if (bVar4) {
LAB_002b7368:
      piVar1 = &(in_RSI->options_).recursion_depth;
      *piVar1 = *piVar1 + 1;
LAB_002b736c:
      (this->stream_).stream_ = (ZeroCopyInputStream *)0x1;
      goto LAB_002b71a8;
    }
    do {
      SkipToToken(this);
      if ((this->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_002b71a8;
      absl::lts_20240722::
      StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::StatusOr((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                  *)&local_e0[0].status_);
      cVar3 = ZeroCopyBufferedStream::PeekChar(&in_RSI->stream_);
      if ((cVar3 == '\"') ||
         (cVar3 = ZeroCopyBufferedStream::PeekChar(&in_RSI->stream_), cVar3 == '\'')) {
        ParseUtf8((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                   *)&local_88,in_RSI);
        absl::lts_20240722::internal_statusor::
        StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::operator=((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                     *)&local_e0[0].status_,&local_88);
      }
      else {
        if ((in_RSI->options_).allow_legacy_syntax != true) {
          JsonLocation::Invalid((JsonLocation *)this,&in_RSI->json_loc_,0xc,"expected \'\"\'");
          goto LAB_002b7109;
        }
        ParseBareWord((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       *)&local_88,in_RSI);
        absl::lts_20240722::internal_statusor::
        StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::operator=((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                     *)&local_e0[0].status_,&local_88);
      }
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::~StatusOrData(&local_88);
      (this->stream_).stream_ = (ZeroCopyInputStream *)local_e0[0];
      aVar7 = local_e0[0];
      if (((ulong)local_e0[0] & 1) == 0) {
        LOCK();
        *(int *)local_e0[0] = *(int *)local_e0[0] + 1;
        UNLOCK();
        aVar7.status_.rep_ = (Status)(this->stream_).stream_;
      }
      if ((aVar7 != (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                     )0x1) || (Expect(this), (this->stream_).stream_ != (ZeroCopyInputStream *)0x1))
      goto LAB_002b7109;
      if (local_e0[0] !=
          (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )0x1) goto LAB_002b7449;
      SkipValue(this);
      if ((this->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_002b7109;
      literal_00._M_str = ",";
      literal_00._M_len = 1;
      bVar4 = Peek(in_RSI,literal_00);
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       *)&local_e0[0].status_);
      literal_01._M_str = "}";
      literal_01._M_len = 1;
      bVar5 = Peek(in_RSI,literal_01);
      if (bVar5) {
        piVar1 = &(in_RSI->options_).recursion_depth;
        *piVar1 = *piVar1 + 1;
        if ((!bVar4) || ((in_RSI->options_).allow_legacy_syntax != false)) goto LAB_002b736c;
        pcVar8 = "expected \'}\'";
        goto LAB_002b7406;
      }
    } while (bVar4);
    pcVar8 = "expected \',\'";
    goto LAB_002b7406;
  case 1:
    Expect(this);
    if ((this->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_002b71a8;
    iVar2 = (in_RSI->options_).recursion_depth;
    if (iVar2 == 0) {
      JsonLocation::Invalid
                ((JsonLocation *)this,&in_RSI->json_loc_,0x22,"JSON content was too deeply nested");
      if ((this->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_002b71a8;
    }
    else {
      (in_RSI->options_).recursion_depth = iVar2 + -1;
      (this->stream_).stream_ = (ZeroCopyInputStream *)0x1;
    }
    literal_02._M_str = "]";
    literal_02._M_len = 1;
    bVar4 = Peek(in_RSI,literal_02);
    if (bVar4) goto LAB_002b7368;
    do {
      SkipValue(this);
      if ((this->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_002b71a8;
      literal_03._M_str = ",";
      literal_03._M_len = 1;
      bVar4 = Peek(in_RSI,literal_03);
      literal_04._M_str = "]";
      literal_04._M_len = 1;
      bVar5 = Peek(in_RSI,literal_04);
      if (bVar5) {
        if ((!bVar4) || ((in_RSI->options_).allow_legacy_syntax != false)) goto LAB_002b7368;
        pcVar8 = "expected \']\'";
        goto LAB_002b7406;
      }
    } while (bVar4);
    pcVar8 = "expected \',\'";
LAB_002b7406:
    JsonLocation::Invalid((JsonLocation *)this,&in_RSI->json_loc_,0xc,pcVar8);
    goto LAB_002b71a8;
  case 2:
    ParseUtf8((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
               *)&local_e0[0].status_,in_RSI);
    aVar7 = local_e0[0];
    if (local_e0[0] !=
        (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
         )0x1) {
      local_e0[0] = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                     )0x37;
    }
    (this->stream_).stream_ = (ZeroCopyInputStream *)aVar7;
LAB_002b7109:
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                     *)&local_e0[0].status_);
    goto LAB_002b71a8;
  case 3:
    ParseNumber((StatusOr<google::protobuf::json_internal::LocationWith<double>_> *)
                &local_e0[0].status_,in_RSI);
    aVar7 = local_e0[0];
    if (local_e0[0] !=
        (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
         )0x1) {
      local_e0[0] = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                     )0x37;
    }
    (this->stream_).stream_ = (ZeroCopyInputStream *)aVar7;
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::LocationWith<double>_>::~StatusOrData
              ((StatusOrData<google::protobuf::json_internal::LocationWith<double>_> *)
               &local_e0[0].status_);
    goto LAB_002b71a8;
  case 4:
    break;
  case 5:
    break;
  case 6:
    break;
  default:
    goto switchD_002b7098_default;
  }
  Expect(this);
LAB_002b71a8:
  absl::lts_20240722::internal_statusor::
  StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>::~StatusOrData
            ((StatusOrData<google::protobuf::json_internal::JsonLexer::Kind> *)&local_f0.status_);
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status JsonLexer::SkipValue() {
  absl::StatusOr<Kind> kind = PeekKind();
  RETURN_IF_ERROR(kind.status());

  switch (*kind) {
    case JsonLexer::kObj:
      return VisitObject(
          [this](LocationWith<MaybeOwnedString>&) { return SkipValue(); });
    case JsonLexer::kArr:
      return VisitArray([this] { return SkipValue(); });
    case JsonLexer::kStr:
      return ParseUtf8().status();
    case JsonLexer::kNum:
      return ParseNumber().status();
    case JsonLexer::kTrue:
      return Expect("true");
    case JsonLexer::kFalse:
      return Expect("false");
    case JsonLexer::kNull:
      return Expect("null");
    default:
      break;
  }
  // Some compilers seem to fail to realize this is a basic block
  // terminator and incorrectly believe this function is missing
  // a return.
  ABSL_CHECK(false) << "unreachable";
  return absl::OkStatus();
}